

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

int __thiscall
cmsys::RegExpFind::regtry(RegExpFind *this,char *string,char **start,char **end,char *prog)

{
  int iVar1;
  char **local_50;
  char **ep;
  char **sp1;
  int i;
  char *prog_local;
  char **end_local;
  char **start_local;
  char *string_local;
  RegExpFind *this_local;
  
  this->reginput = string;
  this->regstartp = start;
  this->regendp = end;
  local_50 = end;
  ep = start;
  for (sp1._4_4_ = 10; 0 < sp1._4_4_; sp1._4_4_ = sp1._4_4_ + -1) {
    *ep = (char *)0x0;
    *local_50 = (char *)0x0;
    local_50 = local_50 + 1;
    ep = ep + 1;
  }
  iVar1 = regmatch(this,prog + 1);
  if (iVar1 != 0) {
    *start = string;
    *end = this->reginput;
  }
  this_local._4_4_ = (uint)(iVar1 != 0);
  return this_local._4_4_;
}

Assistant:

int RegExpFind::regtry(const char* string, const char** start,
                       const char** end, const char* prog)
{
  int i;
  const char** sp1;
  const char** ep;

  reginput = string;
  regstartp = start;
  regendp = end;

  sp1 = start;
  ep = end;
  for (i = RegularExpressionMatch::NSUBEXP; i > 0; i--) {
    *sp1++ = KWSYS_NULLPTR;
    *ep++ = KWSYS_NULLPTR;
  }
  if (regmatch(prog + 1)) {
    start[0] = string;
    end[0] = reginput;
    return (1);
  } else
    return (0);
}